

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O0

void llvm::yaml::MappingTraits<llvm::DWARFYAML::LineTableOpcode>::mapping
               (IO *IO,LineTableOpcode *LineTableOpcode)

{
  bool bVar1;
  uint uVar2;
  LineTableOpcode *LineTableOpcode_local;
  IO *IO_local;
  
  yaml::IO::mapRequired<llvm::dwarf::LineNumberOps>(IO,"Opcode",&LineTableOpcode->Opcode);
  if (LineTableOpcode->Opcode == DW_LNS_extended_op) {
    yaml::IO::mapRequired<unsigned_long>(IO,"ExtLen",&LineTableOpcode->ExtLen);
    yaml::IO::mapRequired<llvm::dwarf::LineNumberExtendedOps>
              (IO,"SubOpcode",&LineTableOpcode->SubOpcode);
  }
  bVar1 = std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::empty
                    (&LineTableOpcode->UnknownOpcodeData);
  if ((!bVar1) || (uVar2 = (*IO->_vptr_IO[2])(), (uVar2 & 1) == 0)) {
    yaml::IO::mapOptional<std::vector<llvm::yaml::Hex8,std::allocator<llvm::yaml::Hex8>>>
              (IO,"UnknownOpcodeData",&LineTableOpcode->UnknownOpcodeData);
  }
  bVar1 = std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::empty
                    (&LineTableOpcode->UnknownOpcodeData);
  if ((!bVar1) || (uVar2 = (*IO->_vptr_IO[2])(), (uVar2 & 1) == 0)) {
    yaml::IO::mapOptional<std::vector<llvm::yaml::Hex64,std::allocator<llvm::yaml::Hex64>>>
              (IO,"StandardOpcodeData",&LineTableOpcode->StandardOpcodeData);
  }
  bVar1 = StringRef::empty(&(LineTableOpcode->FileEntry).Name);
  if ((!bVar1) || (uVar2 = (*IO->_vptr_IO[2])(), (uVar2 & 1) == 0)) {
    yaml::IO::mapOptional<llvm::DWARFYAML::File>(IO,"FileEntry",&LineTableOpcode->FileEntry);
  }
  if ((LineTableOpcode->Opcode == DW_LNS_advance_line) ||
     (uVar2 = (*IO->_vptr_IO[2])(), (uVar2 & 1) == 0)) {
    yaml::IO::mapOptional<long>(IO,"SData",&LineTableOpcode->SData);
  }
  yaml::IO::mapOptional<unsigned_long>(IO,"Data",&LineTableOpcode->Data);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::LineTableOpcode>::mapping(
    IO &IO, DWARFYAML::LineTableOpcode &LineTableOpcode) {
  IO.mapRequired("Opcode", LineTableOpcode.Opcode);
  if (LineTableOpcode.Opcode == dwarf::DW_LNS_extended_op) {
    IO.mapRequired("ExtLen", LineTableOpcode.ExtLen);
    IO.mapRequired("SubOpcode", LineTableOpcode.SubOpcode);
  }

  if (!LineTableOpcode.UnknownOpcodeData.empty() || !IO.outputting())
    IO.mapOptional("UnknownOpcodeData", LineTableOpcode.UnknownOpcodeData);
  if (!LineTableOpcode.UnknownOpcodeData.empty() || !IO.outputting())
    IO.mapOptional("StandardOpcodeData", LineTableOpcode.StandardOpcodeData);
  if (!LineTableOpcode.FileEntry.Name.empty() || !IO.outputting())
    IO.mapOptional("FileEntry", LineTableOpcode.FileEntry);
  if (LineTableOpcode.Opcode == dwarf::DW_LNS_advance_line || !IO.outputting())
    IO.mapOptional("SData", LineTableOpcode.SData);
  IO.mapOptional("Data", LineTableOpcode.Data);
}